

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

void duckdb::GetTableRefCountsExpr
               (case_insensitive_map_t<idx_t> *cte_ref_counts,ParsedExpression *expr)

{
  SubqueryExpression *pSVar1;
  pointer pSVar2;
  type node;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  if ((expr->super_BaseExpression).type == SUBQUERY) {
    pSVar1 = BaseExpression::Cast<duckdb::SubqueryExpression>(&expr->super_BaseExpression);
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&pSVar1->subquery);
    node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                     (&pSVar2->node);
    GetTableRefCountsNode(cte_ref_counts,node);
    return;
  }
  local_28._8_8_ = 0;
  pcStack_10 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder.cpp:219:13)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder.cpp:219:13)>
             ::_M_manager;
  local_28._M_unused._M_object = cte_ref_counts;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

static void GetTableRefCountsExpr(case_insensitive_map_t<idx_t> &cte_ref_counts, ParsedExpression &expr) {
	if (expr.GetExpressionType() == ExpressionType::SUBQUERY) {
		auto &subquery = expr.Cast<SubqueryExpression>();
		GetTableRefCountsNode(cte_ref_counts, *subquery.subquery->node);
	} else {
		ParsedExpressionIterator::EnumerateChildren(
		    expr, [&](ParsedExpression &expr) { GetTableRefCountsExpr(cte_ref_counts, expr); });
	}
}